

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O1

int testNumberOfNeighborsWithDefaultValueOutOfRange(void)

{
  ulong uVar1;
  TypeUnion this;
  bool bVar2;
  Int64Parameter *pIVar3;
  Int64Range *pIVar4;
  UniformWeighting *pUVar5;
  NearestNeighborsIndex *pNVar6;
  SquaredEuclideanDistance *pSVar7;
  SingleKdTreeIndex *pSVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  Arena *pAVar11;
  Model m1;
  Result res;
  Model MStack_68;
  Result local_38;
  
  CoreML::Specification::Model::Model(&MStack_68,(Arena *)0x0,false);
  CoreML::KNNValidatorTests::generateInterface(&MStack_68);
  if (MStack_68._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&MStack_68);
    MStack_68._oneof_case_[0] = 0x194;
    pAVar11 = (Arena *)(MStack_68.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_68.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    MStack_68.Type_.knearestneighborsclassifier_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::KNearestNeighborsClassifier>(pAVar11);
  }
  this = MStack_68.Type_;
  if (*(Int64Parameter **)
       &((MStack_68.Type_.pipeline_)->models_).super_RepeatedPtrFieldBase.current_size_ ==
      (Int64Parameter *)0x0) {
    uVar1 = ((MStack_68.Type_.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pIVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Parameter>
                       (pAVar11);
    (this.knearestneighborsclassifier_)->numberofneighbors_ = pIVar3;
  }
  pIVar3 = (this.knearestneighborsclassifier_)->numberofneighbors_;
  if (pIVar3->_oneof_case_[0] != 10) {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
    pIVar3->_oneof_case_[0] = 10;
    uVar1 = (pIVar3->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pIVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Range>(pAVar11)
    ;
    (pIVar3->AllowedValues_).range_ = pIVar4;
  }
  ((pIVar3->AllowedValues_).range_)->minvalue_ = 1;
  if (pIVar3->_oneof_case_[0] != 10) {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar3);
    pIVar3->_oneof_case_[0] = 10;
    uVar1 = (pIVar3->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pIVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Range>(pAVar11)
    ;
    (pIVar3->AllowedValues_).range_ = pIVar4;
  }
  ((pIVar3->AllowedValues_).range_)->maxvalue_ = 10;
  pIVar3->defaultvalue_ = 0xf;
  if (((this.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (this.knearestneighborsclassifier_);
    ((this.supportvectorclassifier_)->rho_).total_size_ = 200;
    uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pUVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::UniformWeighting>
                       (pAVar11);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(this.pipeline_)->names_ + 1))->
    uniformweighting_ = pUVar5;
  }
  if ((NearestNeighborsIndex *)(this.pipelineclassifier_)->pipeline_ == (NearestNeighborsIndex *)0x0
     ) {
    uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pNVar6 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::NearestNeighborsIndex>(pAVar11);
    (this.knearestneighborsclassifier_)->nearestneighborsindex_ = pNVar6;
  }
  pNVar6 = (this.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (pNVar6->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(pNVar6);
    pNVar6->_oneof_case_[1] = 200;
    uVar1 = (pNVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pSVar7 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::SquaredEuclideanDistance>(pAVar11);
    (pNVar6->DistanceFunction_).squaredeuclideandistance_ = pSVar7;
  }
  if (pNVar6->_oneof_case_[0] != 0x6e) {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(pNVar6);
    pNVar6->_oneof_case_[0] = 0x6e;
    uVar1 = (pNVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar11 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar11 = *(Arena **)pAVar11;
    }
    pSVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SingleKdTreeIndex>
                       (pAVar11);
    (pNVar6->IndexType_).singlekdtreeindex_ = pSVar8;
  }
  ((pNVar6->IndexType_).singlekdtreeindex_)->leafsize_ = 0x1e;
  if (((this.supportvectorclassifier_)->rho_).current_size_ != 0x6e) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
              (this.knearestneighborsclassifier_);
    ((this.supportvectorclassifier_)->rho_).current_size_ = 0x6e;
    ((DefaultClassLabelUnion *)&(this.pipeline_)->names_)->defaultint64label_ =
         (int64_t)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  uVar1 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)&(this.pipeline_)->names_,"Default",puVar10);
  CoreML::validate<(MLModelType)404>(&local_38,&MStack_68);
  bVar2 = CoreML::Result::good(&local_38);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1e3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_68);
  return (uint)bVar2;
}

Assistant:

int testNumberOfNeighborsWithDefaultValueOutOfRange() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_range()->set_minvalue(1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(15);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since numberOfNeighbors defaultValue is out of range bounds.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}